

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

void lws_hex_from_byte_array(uint8_t *src,size_t slen,char *dest,size_t len)

{
  byte bVar1;
  char *pcVar2;
  uint8_t b;
  char *end;
  size_t len_local;
  char *dest_local;
  size_t slen_local;
  uint8_t *src_local;
  
  len_local = (size_t)dest;
  dest_local = (char *)slen;
  slen_local = (size_t)src;
  while (pcVar2 = (char *)len_local,
        dest_local != (char *)0x0 && (char *)len_local != dest + (len - 1)) {
    bVar1 = *(byte *)slen_local;
    pcVar2 = (char *)(len_local + 1);
    *(char *)len_local = hexch[(int)(uint)bVar1 >> 4];
    if (pcVar2 == dest + (len - 1)) break;
    len_local = len_local + 2;
    *pcVar2 = hexch[(int)(bVar1 & 0xf)];
    dest_local = dest_local + -1;
    slen_local = slen_local + 1;
  }
  len_local = (size_t)pcVar2;
  *(undefined1 *)len_local = 0;
  return;
}

Assistant:

void
lws_hex_from_byte_array(const uint8_t *src, size_t slen, char *dest, size_t len)
{
	char *end = &dest[len - 1];

	while (slen-- && dest != end) {
		uint8_t b = *src++;
		*dest++ = hexch[b >> 4];
		if (dest == end)
			break;
		*dest++ = hexch[b & 0xf];
	}

	*dest = '\0';
}